

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void freeset(parse *p,cset *cs)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  re_guts *prVar4;
  cset *pcVar5;
  long lVar6;
  long lVar7;
  
  prVar4 = p->g;
  pcVar5 = prVar4->sets;
  iVar2 = prVar4->ncsets;
  iVar3 = prVar4->csetsize;
  lVar6 = 0;
  for (lVar7 = 0; -lVar7 != (long)iVar3; lVar7 = lVar7 + -1) {
    cs->ptr[lVar6 >> 0x20] = cs->ptr[lVar6 >> 0x20] & ~cs->mask;
    cs->hash = cs->hash + (char)lVar7;
    lVar6 = lVar6 + 0x100000000;
  }
  if (pcVar5 + (long)iVar2 + -1 == cs) {
    piVar1 = &p->g->ncsets;
    *piVar1 = *piVar1 + -1;
  }
  return;
}

Assistant:

static void
freeset(p, cs)
struct parse *p;
cset *cs;
{
	size_t i;
	cset *top = &p->g->sets[p->g->ncsets];
	size_t css = (size_t)p->g->csetsize;

	for (i = 0; i < css; i++)
		CHsub(cs, i);
	if (cs == top-1)	/* recover only the easy case */
		p->g->ncsets--;
}